

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cfgable.c
# Opt level: O0

void config_free(OperationConfig *config)

{
  OperationConfig *pOVar1;
  OperationConfig *prev;
  OperationConfig *last;
  OperationConfig *config_local;
  
  prev = config;
  while (prev != (OperationConfig *)0x0) {
    pOVar1 = prev->prev;
    free_config_fields(prev);
    free(prev);
    prev = pOVar1;
  }
  return;
}

Assistant:

void config_free(struct OperationConfig *config)
{
  struct OperationConfig *last = config;

  /* Free each of the structures in reverse order */
  while(last) {
    struct OperationConfig *prev = last->prev;

    free_config_fields(last);
    free(last);

    last = prev;
  }
}